

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFMatrix.cc
# Opt level: O0

Matrix * __thiscall QPDFMatrix::getAsMatrix(Matrix *__return_storage_ptr__,QPDFMatrix *this)

{
  QPDFMatrix *this_local;
  
  QPDFObjectHandle::Matrix::Matrix
            (__return_storage_ptr__,this->a,this->b,this->c,this->d,this->e,this->f);
  return __return_storage_ptr__;
}

Assistant:

QPDFObjectHandle::Matrix
QPDFMatrix::getAsMatrix() const
{
    return {a, b, c, d, e, f};
}